

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraphInternal::MatchesCondition::Evaluate
          (MatchesCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  ExpandMacroResult EVar1;
  bool local_2b3;
  _Optional_payload_base<bool> local_2b2;
  undefined1 local_2b0 [8];
  RegularExpression regex;
  string regexStr;
  undefined1 local_50 [8];
  string str;
  optional<bool> *out_local;
  int version_local;
  MacroExpanderVector *expanders_local;
  MatchesCondition *this_local;
  
  str.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50,(string *)&this->String);
  EVar1 = ExpandMacros((string *)local_50,expanders,version);
  if (EVar1 != Ok) {
    if (EVar1 == Ignore) {
      std::optional<bool>::reset((optional<bool> *)str.field_2._8_8_);
      this_local._7_1_ = true;
      goto LAB_002412f3;
    }
    if (EVar1 == Error) {
      this_local._7_1_ = false;
      goto LAB_002412f3;
    }
  }
  std::__cxx11::string::string((string *)&regex.progsize,(string *)&this->Regex);
  EVar1 = ExpandMacros((string *)&regex.progsize,expanders,version);
  if (EVar1 == Ok) {
LAB_00241226:
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_2b0);
    this_local._7_1_ =
         cmsys::RegularExpression::compile((RegularExpression *)local_2b0,(string *)&regex.progsize)
    ;
    if (this_local._7_1_) {
      local_2b3 = cmsys::RegularExpression::find((RegularExpression *)local_2b0,(string *)local_50);
      std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_2b2,&local_2b3);
      *(_Optional_payload_base<bool> *)str.field_2._8_8_ = local_2b2;
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_2b0);
  }
  else if (EVar1 == Ignore) {
    std::optional<bool>::reset((optional<bool> *)str.field_2._8_8_);
    this_local._7_1_ = true;
  }
  else {
    if (EVar1 != Error) goto LAB_00241226;
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)&regex.progsize);
LAB_002412f3:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmCMakePresetsGraphInternal::MatchesCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);
  std::string regexStr = this->Regex;
  CHECK_EXPAND(out, regexStr, expanders, version);

  cmsys::RegularExpression regex;
  if (!regex.compile(regexStr)) {
    return false;
  }

  out = regex.find(str);
  return true;
}